

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void * asm_callx_func(ASMState *as,IRIns *irf,IRRef func)

{
  MCode *p;
  IRRef func_local;
  IRIns *irf_local;
  ASMState *as_local;
  
  if (func < 0x8000) {
    if ((irf->field_1).o == '\x1c') {
      p = *(MCode **)(ulong)(irf->field_1).op12;
    }
    else {
      p = (MCode *)(ulong)(irf->field_1).op12;
    }
    if ((long)p - (long)as->mcp == (long)((int)p - (int)as->mcp)) {
      return p;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *asm_callx_func(ASMState *as, IRIns *irf, IRRef func)
{
#if LJ_32
  UNUSED(as);
  if (irref_isk(func))
    return (void *)irf->i;
#else
  if (irref_isk(func)) {
    MCode *p;
    if (irf->o == IR_KINT64)
      p = (MCode *)(void *)ir_k64(irf)->u64;
    else
      p = (MCode *)(void *)(uintptr_t)(uint32_t)irf->i;
    if (p - as->mcp == (int32_t)(p - as->mcp))
      return p;  /* Call target is still in +-2GB range. */
    /* Avoid the indirect case of emit_call(). Try to hoist func addr. */
  }
#endif
  return NULL;
}